

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O3

void __thiscall
kj::_::AdapterPromiseNode<int,kj::UnixEventPort::ChildExitPromiseAdapter>::
AdapterPromiseNode<kj::UnixEventPort::ChildSet&,kj::Maybe<int>&>
          (AdapterPromiseNode<int,kj::UnixEventPort::ChildExitPromiseAdapter> *this,ChildSet *params
          ,Maybe<int> *params_1)

{
  *(undefined8 *)(this + 8) = 0;
  *(undefined8 *)(this + 0x10) = 0;
  *(undefined ***)this = &PTR_destroy_00620ea0;
  *(undefined ***)(this + 0x18) = &PTR_reject_00620ef0;
  this[0x20] = (AdapterPromiseNode<int,kj::UnixEventPort::ChildExitPromiseAdapter>)0x0;
  this[0x1b8] = (AdapterPromiseNode<int,kj::UnixEventPort::ChildExitPromiseAdapter>)0x0;
  this[0x1c0] = (AdapterPromiseNode<int,kj::UnixEventPort::ChildExitPromiseAdapter>)0x1;
  UnixEventPort::ChildExitPromiseAdapter::ChildExitPromiseAdapter
            ((ChildExitPromiseAdapter *)(this + 0x1c8),(PromiseFulfiller<int> *)(this + 0x18),params
             ,params_1);
  return;
}

Assistant:

AdapterPromiseNode(Params&&... params)
      : adapter(static_cast<PromiseFulfiller<UnfixVoid<T>>&>(*this), kj::fwd<Params>(params)...) {}